

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O1

long GetStreamWriteAvailable(PaStream *s)

{
  bool bVar1;
  unsigned_long uVar2;
  ulong uVar3;
  int xrun;
  unsigned_long avail;
  int local_14;
  unsigned_long local_10;
  
  paUtilErr_ = PaAlsaStreamComponent_GetAvailableFrames
                         ((PaAlsaStreamComponent *)((long)s + 0x308),&local_10,&local_14);
  if (paUtilErr_ < 0) {
    PaUtil_DebugPrint(
                     "Expression \'PaAlsaStreamComponent_GetAvailableFrames( &stream->playback, &avail, &xrun )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4534\n"
                     );
    uVar3 = (ulong)(uint)paUtilErr_;
  }
  else {
    if (local_14 == 0) {
      return local_10;
    }
    paUtilErr_ = PaAlsaStream_HandleXrun((PaAlsaStream *)s);
    if (paUtilErr_ < 0) {
      PaUtil_DebugPrint(
                       "Expression \'PaAlsaStream_HandleXrun( stream )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4539\n"
                       );
      bVar1 = true;
      uVar3 = (ulong)(uint)paUtilErr_;
    }
    else {
      uVar2 = snd_pcm_avail_update(*(undefined8 *)((long)s + 0x340));
      uVar3 = 0;
      if ((int)uVar2 < 0) {
        GetStreamWriteAvailable_cold_1();
        bVar1 = true;
        uVar3 = 0xffffd8f1;
      }
      else {
        bVar1 = false;
        local_10 = uVar2;
      }
    }
    if (!bVar1) {
      if (!bVar1) {
        return local_10;
      }
      return uVar3;
    }
  }
  return (long)(int)uVar3;
}

Assistant:

static signed long GetStreamWriteAvailable( PaStream* s )
{
    PaError result = paNoError;
    PaAlsaStream *stream = (PaAlsaStream*)s;
    unsigned long avail;
    int xrun;

    PA_ENSURE( PaAlsaStreamComponent_GetAvailableFrames( &stream->playback, &avail, &xrun ) );
    if( xrun )
    {
        snd_pcm_sframes_t savail;

        PA_ENSURE( PaAlsaStream_HandleXrun( stream ) );
        savail = alsa_snd_pcm_avail_update( stream->playback.pcm );

        /* savail should not contain -EPIPE now, since PaAlsaStream_HandleXrun will only prepare the pcm */
        ENSURE_( savail, paUnanticipatedHostError );

        avail = (unsigned long) savail;
    }

    return (signed long)avail;

error:
    return result;
}